

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O1

base_learner * svrg_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  option_group_definition *this;
  typed_option<int> *ptVar2;
  learner<SVRG::svrg,_example> *plVar3;
  uint32_t *puVar4;
  bool svrg_option;
  free_ptr<SVRG::svrg> s;
  option_group_definition new_options;
  bool local_3a1;
  free_ptr<SVRG::svrg> local_3a0;
  vw *local_390;
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  option_group_definition local_348;
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  string local_2f0;
  string local_2d0;
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  typed_option<int> local_210;
  typed_option<int> local_170;
  typed_option<bool> local_d0;
  
  local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.super__Head_base<0UL,_SVRG::svrg_*,_false>.
  _M_head_impl = calloc_or_throw<SVRG::svrg>(1);
  (local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.super__Head_base<0UL,_SVRG::svrg_*,_false>
  ._M_head_impl)->stage_size = 0;
  (local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.super__Head_base<0UL,_SVRG::svrg_*,_false>
  ._M_head_impl)->prev_pass = 0;
  *(undefined8 *)
   &(local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->stable_grad_count = 0;
  (local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.super__Head_base<0UL,_SVRG::svrg_*,_false>
  ._M_head_impl)->all = (vw *)0x0;
  local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<SVRG::svrg>;
  local_3a1 = false;
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,"Stochastic Variance Reduced Gradient","");
  local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_348,local_368,local_368 + local_360);
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"svrg","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_2d0,&local_3a1);
  local_240 = true;
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,"Streaming Stochastic Variance Reduced Gradient","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_2b0);
  this = VW::config::option_group_definition::add<bool>(&local_348,&local_d0);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"stage_size","");
  VW::config::typed_option<int>::typed_option
            (&local_210,&local_2f0,
             &(local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->stage_size);
  local_390 = all;
  ptVar2 = VW::config::typed_option<int>::default_value(&local_210,1);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,"Number of passes per SVRG stage","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_170,ptVar2);
  VW::config::option_group_definition::add<int>(this,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ccaf0;
  if (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_310[0] != local_300) {
    operator_delete(local_310[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ccaf0;
  if (local_210.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_388[0] != local_378) {
    operator_delete(local_388[0]);
  }
  pvVar1 = local_390;
  local_2b0._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_348);
  if (local_3a1 == false) {
    plVar3 = (learner<SVRG::svrg,_example> *)0x0;
  }
  else {
    (local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->all = pvVar1;
    (local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->prev_pass = -1;
    (local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->stable_grad_count = 0;
    if ((pvVar1->weights).sparse == true) {
      sparse_parameters::stride_shift(&(pvVar1->weights).sparse_weights,2);
    }
    else {
      (pvVar1->weights).dense_weights._stride_shift = 2;
    }
    puVar4 = &(pvVar1->weights).dense_weights._stride_shift;
    if ((pvVar1->weights).sparse != false) {
      puVar4 = &(pvVar1->weights).sparse_weights._stride_shift;
    }
    plVar3 = LEARNER::init_learner<SVRG::svrg,example,LEARNER::learner<char,example>>
                       (&local_3a0,SVRG::learn,SVRG::predict,1L << ((byte)*puVar4 & 0x3f));
    *(code **)(plVar3 + 0x80) = SVRG::save_load;
    *(undefined8 *)(plVar3 + 0x70) = *(undefined8 *)(plVar3 + 0x18);
    *(undefined8 *)(plVar3 + 0x78) = *(undefined8 *)(plVar3 + 0x20);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_348.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
    operator_delete(local_348.m_name._M_dataplus._M_p);
  }
  if (local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl != (svrg *)0x0) {
    (*(code *)local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_3a0._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar3;
}

Assistant:

base_learner* svrg_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<svrg>();

  bool svrg_option = false;
  option_group_definition new_options("Stochastic Variance Reduced Gradient");
  new_options.add(make_option("svrg", svrg_option).keep().help("Streaming Stochastic Variance Reduced Gradient"))
      .add(make_option("stage_size", s->stage_size).default_value(1).help("Number of passes per SVRG stage"));
  options.add_and_parse(new_options);

  if (!svrg_option)
  {
    return nullptr;
  }

  s->all = &all;
  s->prev_pass = -1;
  s->stable_grad_count = 0;

  // Request more parameter storage (4 floats per feature)
  all.weights.stride_shift(2);
  learner<svrg, example>& l = init_learner(s, learn, predict, UINT64_ONE << all.weights.stride_shift());
  l.set_save_load(save_load);
  return make_base(l);
}